

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O3

Element __thiscall ftxui::anon_unknown_3::ButtonBase::Render(ButtonBase *this)

{
  char cVar1;
  Components *pCVar2;
  bool bVar3;
  Components *pCVar4;
  ComponentBase *pCVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  ComponentBase *in_RSI;
  code *pcVar7;
  Element EVar8;
  Element local_e0;
  Element local_d0;
  Element local_c0;
  _Any_data local_b0;
  code *local_a0;
  string local_90;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  bVar3 = ComponentBase::Focused(in_RSI);
  if (bVar3) {
    pcVar7 = inverted;
  }
  else {
    pcVar7 = nothing;
  }
  pCVar2 = (Components *)
           in_RSI[3].children_.
           super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pCVar4 = &in_RSI[3].children_;
  if (pCVar2 != (Components *)0x0) {
    pCVar4 = pCVar2;
  }
  cVar1 = *(char *)&(pCVar4->
                    super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
  pCVar5 = in_RSI + 1;
  if (in_RSI[1].parent_ != (ComponentBase *)0x0) {
    pCVar5 = in_RSI[1].parent_;
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pCVar5->_vptr_ComponentBase,
             (long)&(((pCVar5->children_).
                      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
             (long)pCVar5->_vptr_ComponentBase);
  text((ftxui *)&local_e0,&local_90);
  if (cVar1 == '\0') {
    local_50._M_unused._M_object = nothing;
  }
  else {
    local_50._M_unused._M_object = border;
  }
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_manager;
  operator|((ftxui *)&local_d0,&local_e0,(Decorator *)&local_50);
  local_70._8_8_ = 0;
  local_58 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
             ::_M_manager;
  local_70._M_unused._M_function_pointer = pcVar7;
  operator|((ftxui *)&local_c0,&local_d0,(Decorator *)&local_70);
  reflect((Box *)&in_RSI[2].parent_);
  EVar8 = operator|((ftxui *)this,&local_c0,(Decorator *)&local_b0);
  _Var6 = EVar8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_a0 != (code *)0x0) {
    (*local_a0)(&local_b0,&local_b0,__destroy_functor);
    _Var6._M_pi = extraout_RDX;
  }
  if (local_c0.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var6._M_pi = extraout_RDX_00;
  }
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
    _Var6._M_pi = extraout_RDX_01;
  }
  if (local_d0.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var6._M_pi = extraout_RDX_02;
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
    _Var6._M_pi = extraout_RDX_03;
  }
  if (local_e0.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var6._M_pi = extraout_RDX_04;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    _Var6._M_pi = extraout_RDX_05;
  }
  EVar8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi;
  EVar8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() override {
    auto style = Focused() ? inverted : nothing;
    auto my_border = option_->border ? border : nothing;
    return text(*label_) | my_border | style | reflect(box_);
  }